

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O3

int __thiscall xmrig::Client::close(Client *this,int __fd)

{
  SocketState SVar1;
  uv_tcp_t *puVar2;
  int iVar3;
  int iVar4;
  undefined8 unaff_RBP;
  undefined7 uVar5;
  undefined4 in_register_00000034;
  
  SVar1 = (this->super_BaseClient).m_state;
  if (SVar1 != UnconnectedState) {
    uVar5 = (undefined7)((ulong)unaff_RBP >> 8);
    if (SVar1 == ClosingState) {
      return (int)CONCAT71(uVar5,this->m_socket != (uv_tcp_t *)0x0);
    }
    puVar2 = this->m_socket;
    if (puVar2 != (uv_tcp_t *)0x0) {
      if (SVar1 != ClosingState) {
        (this->super_BaseClient).m_state = ClosingState;
      }
      iVar3 = uv_is_closing(puVar2,CONCAT44(in_register_00000034,__fd));
      iVar4 = (int)CONCAT71(uVar5,1);
      if (iVar3 != 0) {
        return iVar4;
      }
      uv_close(this->m_socket,onClose);
      return iVar4;
    }
  }
  return 0;
}

Assistant:

bool xmrig::Client::close()
{
    if (m_state == ClosingState) {
        return m_socket != nullptr;
    }

    if (m_state == UnconnectedState || m_socket == nullptr) {
        return false;
    }

    setState(ClosingState);

    if (uv_is_closing(reinterpret_cast<uv_handle_t*>(m_socket)) == 0) {
        uv_close(reinterpret_cast<uv_handle_t*>(m_socket), Client::onClose);
    }

    return true;
}